

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDataBlock.cpp
# Opt level: O3

vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *
ZXing::DataMatrix::GetDataBlocks
          (vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
           *__return_storage_ptr__,ByteArray *rawCodewords,Version *version,bool fix259)

{
  pointer puVar1;
  int iVar2;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar3;
  long lVar4;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar5;
  int iVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  anon_struct_8_2_fb5c1508 *paVar15;
  long lVar16;
  value_type_conflict local_8e;
  allocator_type local_8d;
  undefined4 local_8c;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_88;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *local_70;
  size_type local_68;
  ByteArray *local_60;
  long local_58;
  DataBlock local_50;
  
  local_8c = (undefined4)CONCAT71(in_register_00000009,fix259);
  local_68 = (long)(version->ecBlocks).blocks[1].count + (long)(version->ecBlocks).blocks[0].count;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = __return_storage_ptr__;
  local_60 = rawCodewords;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::reserve
            (&local_88,local_68);
  paVar15 = (version->ecBlocks).blocks;
  lVar4 = 0x18;
  do {
    local_58 = lVar4;
    if (0 < paVar15->count) {
      iVar8 = 0;
      do {
        local_50.numDataCodewords = paVar15->dataCodewords;
        local_8e = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_50.codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)(version->ecBlocks).codewordsPerBlock + (long)local_50.numDataCodewords,
                   &local_8e,&local_8d);
        std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
        emplace_back<ZXing::DataMatrix::DataBlock>(&local_88,&local_50);
        if (local_50.codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < paVar15->count);
    }
    pvVar3 = local_70;
    paVar15 = (anon_struct_8_2_fb5c1508 *)((long)((version->ecBlocks).blocks + -2) + local_58);
    lVar4 = local_58 + 8;
  } while (lVar4 != 0x28);
  iVar6 = *(int *)&((local_88.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start)->codewords).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&((local_88.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start)->codewords).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar8 = (version->ecBlocks).codewordsPerBlock;
  iVar10 = iVar6 - iVar8;
  uVar12 = 0;
  uVar9 = (uint)local_68;
  if (1 < iVar10) {
    uVar13 = 0;
    uVar12 = 0;
    do {
      if (0 < (int)uVar9) {
        lVar14 = (long)(int)uVar12;
        lVar16 = 8;
        lVar4 = 0;
        do {
          puVar1 = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14;
          lVar14 = lVar14 + 1;
          *(uchar *)(*(long *)((long)&(local_88.
                                       super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->numDataCodewords
                              + lVar16) + uVar13) = *puVar1;
          lVar4 = lVar4 + -1;
          lVar16 = lVar16 + 0x20;
        } while (-lVar4 != (local_68 & 0xffffffff));
        uVar12 = (ulong)(uint)((int)uVar12 - (int)lVar4);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != iVar10 - 1U);
  }
  iVar2 = version->symbolHeight;
  uVar7 = 8;
  if (iVar2 != 0x90) {
    uVar7 = uVar9;
  }
  if (0 < (int)uVar7) {
    uVar12 = (ulong)(int)uVar12;
    lVar4 = 0;
    do {
      puVar1 = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12;
      uVar12 = uVar12 + 1;
      *(uchar *)(*(long *)((long)&((local_88.
                                    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->codewords).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4) +
                (long)(int)(iVar10 - 1U)) = *puVar1;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar7 << 5 != lVar4);
  }
  iVar11 = (int)uVar12;
  if (0 < iVar8) {
    do {
      if (0 < (int)uVar9) {
        lVar4 = 0;
        do {
          uVar7 = (uint)lVar4;
          if ((iVar2 == 0x90 & (byte)local_8c) != 0) {
            uVar7 = (uVar7 + 8) % uVar9;
          }
          local_88.
          super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].codewords.
          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(int)(iVar10 - (uint)(7 < (int)uVar7 && iVar2 == 0x90))]
               = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4 + (int)uVar12];
          lVar4 = lVar4 + 1;
        } while (uVar9 != (uint)lVar4);
        uVar12 = (ulong)((int)uVar12 + (uint)lVar4);
      }
      iVar11 = (int)uVar12;
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar6);
  }
  pvVar5 = local_70;
  if (iVar11 == *(int *)&(local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) {
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar5 = &local_88;
  }
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::~vector
            (&local_88);
  return pvVar3;
}

Assistant:

std::vector<DataBlock> GetDataBlocks(const ByteArray& rawCodewords, const Version& version, bool fix259)
{
	// First count the total number of data blocks
	// Now establish DataBlocks of the appropriate size and number of data codewords
	auto& ecBlocks = version.ecBlocks;
	const int numResultBlocks = ecBlocks.numBlocks();
	std::vector<DataBlock> result;
	result.reserve(numResultBlocks);
	for (auto& ecBlock : ecBlocks.blocks)
		for (int i = 0; i < ecBlock.count; i++)
			result.push_back({ecBlock.dataCodewords, ByteArray(ecBlocks.codewordsPerBlock + ecBlock.dataCodewords)});

	// All blocks have the same amount of data, except that the last n
	// (where n may be 0) have 1 less byte. Figure out where these start.
	// TODO(bbrown): There is only one case where there is a difference for Data Matrix for size 144
	const int numCodewords = Size(result[0].codewords);
	const int numDataCodewords = numCodewords - ecBlocks.codewordsPerBlock;

	// The last elements of result may be 1 element shorter for 144 matrix
	// first fill out as many elements as all of them have minus 1
	int rawCodewordsOffset = 0;
	for (int i = 0; i < numDataCodewords - 1; i++)
		for (int j = 0; j < numResultBlocks; j++)
			result[j].codewords[i] = rawCodewords[rawCodewordsOffset++];

	// Fill out the last data block in the longer ones
	const bool size144x144 = version.symbolHeight == 144;
	const int numLongerBlocks = size144x144 ? 8 : numResultBlocks;
	for (int j = 0; j < numLongerBlocks; j++)
		result[j].codewords[numDataCodewords - 1] = rawCodewords[rawCodewordsOffset++];

	// Now add in error correction blocks
	for (int i = numDataCodewords; i < numCodewords; i++) {
		for (int j = 0; j < numResultBlocks; j++) {
			int jOffset = size144x144 && fix259 ? (j + 8) % numResultBlocks : j;
			int iOffset = size144x144 && jOffset > 7 ? i - 1 : i;
			result[jOffset].codewords[iOffset] = rawCodewords[rawCodewordsOffset++];
		}
	}

	if (rawCodewordsOffset != Size(rawCodewords))
		return {};

	return result;
}